

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_highbd_wiener_convolve_add_src_c
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,
               WienerConvolveParams *conv_params,int bd)

{
  long lVar1;
  ushort uVar2;
  uint uVar3;
  char cVar4;
  uint16_t uVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  uint16_t *puVar10;
  int16_t *b;
  int16_t *extraout_RDX;
  int x;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint16_t *puVar20;
  int y_q4;
  int iVar21;
  uint16_t *puStack_10780;
  int iStack_10760;
  uint16_t temp [33664];
  
  cVar4 = (char)bd;
  bVar8 = (byte)conv_params->round_0;
  uVar11 = (uint)((ulong)filter_y >> 4) & 0xf;
  iVar15 = (int)((h + -1) * y_step_q4 + uVar11) >> 4;
  uVar7 = (ulong)(uint)w;
  if (w < 1) {
    uVar7 = 0;
  }
  iVar6 = -8;
  if (-8 < iVar15) {
    iVar6 = iVar15;
  }
  lVar16 = (long)(src + src_stride * -3) * 2 + -6;
  uVar13 = ~(-1 << ((cVar4 - bVar8) + 8 & 0x1f));
  puVar10 = temp;
  for (iVar15 = 0; iVar15 != iVar6 + 8; iVar15 = iVar15 + 1) {
    uVar17 = (uint)((ulong)filter_x >> 4) & 0xf;
    for (uVar12 = 0; uVar12 != uVar7; uVar12 = uVar12 + 1) {
      lVar1 = lVar16 + (long)((int)uVar17 >> 4) * 2;
      iVar21 = 0;
      for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
        iVar21 = iVar21 + (int)*(short *)((ulong)((uVar17 & 0xf) << 4) +
                                          ((ulong)filter_x & 0xffffffffffffff00) + lVar14 * 2) *
                          (uint)*(ushort *)(lVar1 + lVar14 * 2);
      }
      uVar19 = (int)((uint)*(ushort *)(lVar1 + 6) * 0x80 +
                     ((1 << (bVar8 & 0x1f)) >> 1) + (1 << (cVar4 + 6U & 0x1f)) + iVar21) >>
               (bVar8 & 0x1f);
      uVar3 = uVar13;
      if ((int)uVar19 < (int)uVar13) {
        uVar3 = uVar19;
      }
      uVar5 = (uint16_t)uVar3;
      if ((int)uVar19 < 0) {
        uVar5 = 0;
      }
      puVar10[uVar12] = uVar5;
      uVar17 = uVar17 + x_step_q4;
    }
    lVar16 = lVar16 + src_stride * 2;
    puVar10 = puVar10 + 0x80;
  }
  puStack_10780 = (uint16_t *)((long)dst * 2);
  bVar8 = (byte)conv_params->round_1;
  uVar13 = -1 << ((cVar4 + bVar8) - 1 & 0x1f);
  b = (int16_t *)(ulong)uVar13;
  uVar9 = 0;
  uVar12 = (ulong)(uint)h;
  if (h < 1) {
    uVar12 = uVar9;
  }
  puVar10 = temp;
  while( true ) {
    iStack_10760 = (int)uVar7;
    uVar18 = uVar12;
    puVar20 = puStack_10780;
    uVar17 = uVar11;
    if ((int)uVar9 == iStack_10760) break;
    while (uVar18 != 0) {
      uVar2 = puVar10[(long)((int)uVar17 >> 4) * 0x80 + 0x180];
      iVar15 = highbd_vert_scalar_product
                         (puVar10 + (long)((int)uVar17 >> 4) * 0x80,
                          (ulong)((uVar17 & 0xf) << 4) + ((ulong)filter_y & 0xffffffffffffff00),b);
      uVar5 = clip_pixel_highbd((int)((uint)uVar2 * 0x80 +
                                     iVar15 + ((1 << (bVar8 & 0x1f)) >> 1) + uVar13) >>
                                (bVar8 & 0x1f),bd);
      *puVar20 = uVar5;
      b = extraout_RDX;
      uVar18 = uVar18 - 1;
      puVar20 = puVar20 + dst_stride;
      uVar17 = uVar17 + y_step_q4;
    }
    puVar10 = puVar10 + 1;
    puStack_10780 = puStack_10780 + 1;
    uVar9 = (ulong)((int)uVar9 + 1);
  }
  return;
}

Assistant:

void av1_highbd_wiener_convolve_add_src_c(
    const uint8_t *src, ptrdiff_t src_stride, uint8_t *dst,
    ptrdiff_t dst_stride, const int16_t *filter_x, int x_step_q4,
    const int16_t *filter_y, int y_step_q4, int w, int h,
    const WienerConvolveParams *conv_params, int bd) {
  const InterpKernel *const filters_x = get_filter_base(filter_x);
  const int x0_q4 = get_filter_offset(filter_x, filters_x);

  const InterpKernel *const filters_y = get_filter_base(filter_y);
  const int y0_q4 = get_filter_offset(filter_y, filters_y);

  uint16_t temp[WIENER_MAX_EXT_SIZE * MAX_SB_SIZE];
  const int intermediate_height =
      (((h - 1) * y_step_q4 + y0_q4) >> SUBPEL_BITS) + SUBPEL_TAPS;

  assert(w <= MAX_SB_SIZE);
  assert(h <= MAX_SB_SIZE);
  assert(y_step_q4 <= 32);
  assert(x_step_q4 <= 32);
  assert(bd + FILTER_BITS - conv_params->round_0 + 2 <= 16);

  highbd_convolve_add_src_horiz_hip(src - src_stride * (SUBPEL_TAPS / 2 - 1),
                                    src_stride, temp, MAX_SB_SIZE, filters_x,
                                    x0_q4, x_step_q4, w, intermediate_height,
                                    conv_params->round_0, bd);
  highbd_convolve_add_src_vert_hip(
      temp + MAX_SB_SIZE * (SUBPEL_TAPS / 2 - 1), MAX_SB_SIZE, dst, dst_stride,
      filters_y, y0_q4, y_step_q4, w, h, conv_params->round_1, bd);
}